

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziparchive.cpp
# Opt level: O3

void __thiscall ZipArchive::ZipArchive(ZipArchive *this,string *fileName,int numFiles,int strLen)

{
  uchar *puVar1;
  FILE *pFVar2;
  uchar *__s;
  ulong __n;
  
  this->zipAlign = false;
  this->force64 = false;
  (this->entries)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = (uchar *)0x0;
  (this->f)._vptr_File = (_func_int **)&PTR__File_001b1870;
  (this->f).fp_ = (FILE *)0x0;
  pFVar2 = fopen((fileName->_M_dataplus)._M_p,"wb");
  (this->f).fp_ = (FILE *)pFVar2;
  this->lastHeader = 0;
  __n = (long)numFiles * 0x4e + (long)strLen;
  __s = (uchar *)operator_new__(__n);
  memset(__s,0,__n);
  puVar1 = (this->entries)._M_t.
           super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
           super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  (this->entries)._M_t.super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
  _M_t.super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
  super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl = __s;
  if (puVar1 != (uchar *)0x0) {
    operator_delete__(puVar1);
    __s = (this->entries)._M_t.
          super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
          super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
          super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl;
  }
  this->entryPtr = __s;
  this->entryCount = 0;
  return;
}

Assistant:

ZipArchive::ZipArchive(const std::string& fileName, int numFiles, int strLen)
    : f{fileName, File::WRITE}
{
    static_assert(sizeof(LocalEntry) == 30);
    static_assert(sizeof(CentralDirEntry) == 46);

    entries = std::make_unique<uint8_t[]>(
        strLen + numFiles * (sizeof(CentralDirEntry) + sizeof(Extra64)));
    entryPtr = entries.get();
    entryCount = 0;
}